

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

char * tjGetErrorStr2(tjhandle handle)

{
  long *in_FS_OFFSET;
  tjinstance *this;
  tjhandle handle_local;
  undefined8 local_8;
  
  if ((handle == (tjhandle)0x0) || (*(int *)((long)handle + 0x6d0) == 0)) {
    local_8 = (char *)(*in_FS_OFFSET + -0xd0);
  }
  else {
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    local_8 = (char *)((long)handle + 0x608);
  }
  return local_8;
}

Assistant:

DLLEXPORT char *tjGetErrorStr2(tjhandle handle)
{
  tjinstance *this = (tjinstance *)handle;

  if (this && this->isInstanceError) {
    this->isInstanceError = FALSE;
    return this->errStr;
  } else
    return errStr;
}